

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_header.c
# Opt level: O2

int mk_header_prepare(mk_http_session *cs,mk_http_request *sr,mk_server *server)

{
  mk_list *pmVar1;
  unsigned_long uVar2;
  mk_iov *pmVar3;
  int iVar4;
  char **data;
  size_t sVar5;
  mk_ptr_t *pmVar6;
  long lVar7;
  mk_list *pmVar8;
  long lVar9;
  mk_list *pmVar10;
  char *pcVar11;
  mk_list *pmVar12;
  mk_iov *mk_io;
  uint uVar13;
  ulong uVar14;
  char *buffer;
  unsigned_long len;
  
  len = 0;
  buffer = (char *)0x0;
  iVar4 = (sr->headers).status;
  if (iVar4 == 7) {
    pmVar6 = &(sr->headers).custom_status;
    iVar4 = (int)(sr->headers).custom_status.len;
  }
  else {
    lVar7 = 0;
    do {
      lVar9 = lVar7;
      if (lVar9 + 0x10 == 0x270) {
        mk_print(0x1003,"Bug found in %s() at %s:%d","mk_header_prepare",
                 "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_header.c"
                 ,0xc3);
        abort();
      }
      lVar7 = lVar9 + 0x10;
    } while (*(int *)((long)&status_response[0].status + lVar9) != iVar4);
    pmVar6 = (mk_ptr_t *)((long)&status_response[0].response + lVar9);
    iVar4 = *(int *)((long)&status_response[0].length + lVar9);
  }
  pmVar3 = &(sr->headers).headers_iov;
  mk_iov_add(pmVar3,pmVar6->data,iVar4,0);
  mk_iov_add(pmVar3,(server->clock_context->headers_preset).data,
             (int)(server->clock_context->headers_preset).len,0);
  if (0 < (sr->headers).last_modified) {
    data = (char **)pthread_getspecific(mk_tls_cache_header_lm);
    iVar4 = mk_utils_utime2gmt(data,(sr->headers).last_modified);
    data[1] = (char *)(long)iVar4;
    mk_iov_add(pmVar3,"Last-Modified: ",0xf,0);
    mk_iov_add(pmVar3,*data,*(int *)(data + 1),0);
  }
  iVar4 = (sr->headers).connection;
  if (iVar4 == 0xb) {
    pcVar11 = "Connection: Upgrade\r\n";
    iVar4 = 0x15;
LAB_001071e2:
    mk_iov_add(pmVar3,pcVar11,iVar4,0);
  }
  else if (iVar4 == 0) {
    if (cs->close_now == 0) {
      if (((sr->connection).len == 0) || (sr->protocol == 0xb)) goto LAB_001071ed;
      pcVar11 = "Connection: Keep-Alive\r\n";
      iVar4 = 0x18;
    }
    else {
      pcVar11 = "Connection: Close\r\n";
      iVar4 = 0x13;
    }
    goto LAB_001071e2;
  }
LAB_001071ed:
  if ((sr->headers).location != (char *)0x0) {
    mk_iov_add(pmVar3,"Location: ",10,0);
    pcVar11 = (sr->headers).location;
    sVar5 = strlen(pcVar11);
    mk_iov_add(pmVar3,pcVar11,(int)sVar5,1);
  }
  if ((sr->headers).allow_methods.len != 0) {
    mk_iov_add(pmVar3,"Allow: ",7,0);
    mk_iov_add(pmVar3,(sr->headers).allow_methods.data,(int)(sr->headers).allow_methods.len,0);
  }
  uVar2 = (sr->headers).content_type.len;
  if (uVar2 != 0) {
    mk_iov_add(pmVar3,(sr->headers).content_type.data,(int)uVar2,0);
  }
  if ((sr->headers).transfer_encoding == 0) {
    mk_iov_add(pmVar3,"Transfer-Encoding: chunked\r\n",0x1c,0);
  }
  iVar4 = (sr->headers).etag_len;
  if (0 < iVar4) {
    mk_iov_add(pmVar3,(sr->headers).etag_buf,iVar4,0);
  }
  if ((sr->headers).content_encoding.len != 0) {
    mk_iov_add(pmVar3,"Content-Encoding: ",0x12,0);
    mk_iov_add(pmVar3,(sr->headers).content_encoding.data,(int)(sr->headers).content_encoding.len,0)
    ;
  }
  lVar7 = (sr->headers).content_length;
  if (-1 < lVar7) {
    if ((sr->headers).transfer_encoding != 0) {
      pmVar6 = (mk_ptr_t *)pthread_getspecific(mk_tls_cache_header_cl);
      mk_string_itop((sr->headers).content_length,pmVar6);
      mk_iov_add(pmVar3,"Content-Length: ",0x10,0);
      mk_iov_add(pmVar3,pmVar6->data,(int)pmVar6->len,0);
      lVar7 = (sr->headers).content_length;
    }
    if (lVar7 == 0) goto LAB_001074a4;
  }
  uVar13 = (sr->headers).ranges[0];
  uVar14 = (ulong)uVar13;
  if ((int)uVar13 < 0) {
    if (((sr->headers).ranges[1] < 0) || (server->resume != '\x01')) goto LAB_001074a4;
    buffer = (char *)0x0;
  }
  else {
    if (server->resume != '\x01') goto LAB_001074a4;
    buffer = (char *)0x0;
    if ((sr->headers).ranges[1] == -1) {
      lVar7 = (sr->headers).real_length;
      mk_string_build(&buffer,&len,"%s bytes %d-%ld/%ld\r\n","Content-Range:",uVar14,lVar7 + -1,
                      lVar7);
      mk_iov_add(pmVar3,buffer,(int)len,1);
      uVar13 = (sr->headers).ranges[0];
      uVar14 = (ulong)uVar13;
      if ((int)uVar13 < 0) goto LAB_00107447;
    }
    uVar13 = (sr->headers).ranges[1];
    if ((int)uVar13 < 0) goto LAB_001074a4;
    mk_string_build(&buffer,&len,"%s bytes %d-%d/%ld\r\n","Content-Range:",uVar14,(ulong)uVar13,
                    (sr->headers).real_length);
    mk_iov_add(pmVar3,buffer,(int)len,1);
    uVar13 = (sr->headers).ranges[0];
  }
LAB_00107447:
  if ((uVar13 == 0xffffffff) && (lVar7 = (long)(sr->headers).ranges[1], 0 < lVar7)) {
    lVar9 = (sr->headers).real_length;
    mk_string_build(&buffer,&len,"%s bytes %ld-%ld/%ld\r\n","Content-Range:",lVar9 - lVar7,
                    lVar9 + -1,lVar9);
    mk_iov_add(pmVar3,buffer,(int)len,1);
  }
LAB_001074a4:
  if ((sr->headers).upgrade == 0x14) {
    mk_iov_add(pmVar3,"Upgrade: h2c\r\n",0xe,0);
  }
  if (((sr->headers).cgi == 0) || ((sr->headers).breakline == 1)) {
    mk_io = (sr->headers)._extra_rows;
    if (mk_io == (mk_iov *)0x0) {
      mk_io = pmVar3;
    }
    mk_iov_add(mk_io,"\r\n",2,0);
  }
  (sr->in_headers).buffer = pmVar3;
  pmVar3 = (sr->headers)._extra_rows;
  (sr->in_headers).bytes_total = (sr->headers).headers_iov.total_len;
  (sr->in_headers).cb_finished = mk_header_cb_finished;
  if (pmVar3 != (mk_iov *)0x0) {
    (sr->in_headers_extra).type = 1;
    (sr->in_headers_extra).dynamic = 0;
    (sr->in_headers_extra).cb_consumed = (_func_void_mk_stream_input_ptr_long *)0x0;
    (sr->in_headers_extra).cb_finished = cb_stream_iov_extended_free;
    (sr->in_headers_extra).stream = &sr->stream;
    (sr->in_headers_extra).buffer = pmVar3;
    (sr->in_headers_extra).bytes_total = pmVar3->total_len;
    pmVar1 = &(sr->in_headers_extra)._head;
    pmVar12 = &(sr->in_headers)._head;
    pmVar8 = (sr->stream).inputs.prev;
    if ((pmVar8 == pmVar12) || (pmVar8 == (sr->stream).inputs.next)) {
      pmVar10 = &(sr->stream).inputs;
      pmVar10->prev = pmVar1;
      pmVar12 = (mk_list *)&pmVar8->next;
    }
    else {
      pmVar10 = (sr->in_headers)._head.next;
      (sr->in_headers)._head.next = pmVar1;
      pmVar8 = pmVar12;
      pmVar12 = pmVar10;
    }
    (sr->in_headers_extra)._head.next = pmVar10;
    (sr->in_headers_extra)._head.prev = pmVar8;
    pmVar12->prev = pmVar1;
  }
  (sr->headers).sent = 1;
  return 0;
}

Assistant:

int mk_header_prepare(struct mk_http_session *cs, struct mk_http_request *sr,
                      struct mk_server *server)
{
    int i = 0;
    unsigned long len = 0;
    char *buffer = 0;
    mk_ptr_t response;
    struct response_headers *sh;
    struct mk_iov *iov;

    sh = &sr->headers;
    iov = &sh->headers_iov;

    /* HTTP Status Code */
    if (sh->status == MK_CUSTOM_STATUS) {
        response.data = sh->custom_status.data;
        response.len = sh->custom_status.len;
    }
    else {
        for (i = 0; i < status_response_len; i++) {
            if (status_response[i].status == sh->status) {
                response.data = status_response[i].response;
                response.len  = status_response[i].length;
                break;
            }
        }
    }

    /* Invalid status set */
    mk_bug(i == status_response_len);

    mk_iov_add(iov, response.data, response.len, MK_FALSE);

    /*
     * Preset headers (mk_clock.c):
     *
     * - Server
     * - Date
     */
    mk_iov_add(iov,
               server->clock_context->headers_preset.data,
               server->clock_context->headers_preset.len,
               MK_FALSE);

    /* Last-Modified */
    if (sh->last_modified > 0) {
        mk_ptr_t *lm = MK_TLS_GET(mk_tls_cache_header_lm);
        lm->len = mk_utils_utime2gmt(&lm->data, sh->last_modified);

        mk_iov_add(iov,
                   mk_header_last_modified.data,
                   mk_header_last_modified.len,
                   MK_FALSE);
        mk_iov_add(iov,
                   lm->data,
                   lm->len,
                   MK_FALSE);
    }

    /* Connection */
    if (sh->connection == 0) {
        if (cs->close_now == MK_FALSE) {
            if (sr->connection.len > 0) {
                if (sr->protocol != MK_HTTP_PROTOCOL_11) {
                    mk_iov_add(iov,
                               mk_header_conn_ka.data,
                               mk_header_conn_ka.len,
                               MK_FALSE);
                }
            }
        }
        else {
            mk_iov_add(iov,
                       mk_header_conn_close.data,
                       mk_header_conn_close.len,
                       MK_FALSE);
        }
    }
    else if (sh->connection == MK_HEADER_CONN_UPGRADED) {
             mk_iov_add(iov,
                        mk_header_conn_upgrade.data,
                        mk_header_conn_upgrade.len,
                        MK_FALSE);
    }

    /* Location */
    if (sh->location != NULL) {
        mk_iov_add(iov,
                   mk_header_short_location.data,
                   mk_header_short_location.len,
                   MK_FALSE);

        mk_iov_add(iov,
                   sh->location,
                   strlen(sh->location),
                   MK_TRUE);
    }

    /* allowed methods */
    if (sh->allow_methods.len > 0) {
        mk_iov_add(iov,
                   mk_header_allow.data,
                   mk_header_allow.len,
                   MK_FALSE);
        mk_iov_add(iov,
                   sh->allow_methods.data,
                   sh->allow_methods.len,
                   MK_FALSE);
    }

    /* Content type */
    if (sh->content_type.len > 0) {
        mk_iov_add(iov,
                   sh->content_type.data,
                   sh->content_type.len,
                   MK_FALSE);
    }

    /*
     * Transfer Encoding: the transfer encoding header is just sent when
     * the response has some content defined by the HTTP status response
     */
    switch (sh->transfer_encoding) {
    case MK_HEADER_TE_TYPE_CHUNKED:
        mk_iov_add(iov,
                   mk_header_te_chunked.data,
                   mk_header_te_chunked.len,
                   MK_FALSE);
        break;
    }

    /* E-Tag */
    if (sh->etag_len > 0) {
        mk_iov_add(iov, sh->etag_buf, sh->etag_len, MK_FALSE);
    }

    /* Content-Encoding */
    if (sh->content_encoding.len > 0) {
        mk_iov_add(iov, mk_header_content_encoding.data,
                   mk_header_content_encoding.len,
                   MK_FALSE);
        mk_iov_add(iov, sh->content_encoding.data,
                   sh->content_encoding.len,
                   MK_FALSE);
    }

    /* Content-Length */
    if (sh->content_length >= 0 && sh->transfer_encoding != 0) {
        /* Map content length to MK_POINTER */
        mk_ptr_t *cl = MK_TLS_GET(mk_tls_cache_header_cl);
        mk_string_itop(sh->content_length, cl);

        /* Set headers */
        mk_iov_add(iov,
                   mk_header_content_length.data,
                   mk_header_content_length.len,
                   MK_FALSE);
        mk_iov_add(iov,
                   cl->data,
                   cl->len,
                   MK_FALSE);
    }

    if ((sh->content_length != 0 && (sh->ranges[0] >= 0 || sh->ranges[1] >= 0)) &&
        server->resume == MK_TRUE) {
        buffer = 0;

        /* yyy- */
        if (sh->ranges[0] >= 0 && sh->ranges[1] == -1) {
            mk_string_build(&buffer,
                            &len,
                            "%s bytes %d-%ld/%ld\r\n",
                            RH_CONTENT_RANGE,
                            sh->ranges[0],
                            (sh->real_length - 1), sh->real_length);
            mk_iov_add(iov, buffer, len, MK_TRUE);
        }

        /* yyy-xxx */
        if (sh->ranges[0] >= 0 && sh->ranges[1] >= 0) {
            mk_string_build(&buffer,
                            &len,
                            "%s bytes %d-%d/%ld\r\n",
                            RH_CONTENT_RANGE,
                            sh->ranges[0], sh->ranges[1], sh->real_length);

            mk_iov_add(iov, buffer, len, MK_TRUE);
        }

        /* -xxx */
        if (sh->ranges[0] == -1 && sh->ranges[1] > 0) {
            mk_string_build(&buffer,
                            &len,
                            "%s bytes %ld-%ld/%ld\r\n",
                            RH_CONTENT_RANGE,
                            (sh->real_length - sh->ranges[1]),
                            (sh->real_length - 1), sh->real_length);
            mk_iov_add(iov, buffer, len, MK_TRUE);
        }
    }

    if (sh->upgrade == MK_HEADER_UPGRADED_H2C) {
        mk_iov_add(iov, mk_header_upgrade_h2c.data, mk_header_upgrade_h2c.len,
                   MK_FALSE);
    }


    if (sh->cgi == SH_NOCGI || sh->breakline == MK_HEADER_BREAKLINE) {
        if (!sr->headers._extra_rows) {
            mk_iov_add(iov, mk_iov_crlf.data, mk_iov_crlf.len,
                       MK_FALSE);
        }
        else {
            mk_iov_add(sr->headers._extra_rows, mk_iov_crlf.data,
                       mk_iov_crlf.len, MK_FALSE);
        }
    }

    /*
     * Configure the Stream to dispatch the headers
     */

    /* Set the IOV input stream */
    sr->in_headers.buffer      = iov;
    sr->in_headers.bytes_total = iov->total_len;
    sr->in_headers.cb_finished = mk_header_cb_finished;

    if (sr->headers._extra_rows) {
        /* Our main sr->stream contains the main headers (header_iov)
         * and 'may' have already some linked data. If we have some
         * extra headers rows we need to link this IOV right after
         * the main header_iov.
         */
        struct mk_stream_input *in = &sr->in_headers_extra;
        in->type        = MK_STREAM_IOV;
        in->dynamic     = MK_FALSE;
        in->cb_consumed = NULL;
        in->cb_finished = cb_stream_iov_extended_free;
        in->stream      = &sr->stream;
        in->buffer      = sr->headers._extra_rows;
        in->bytes_total = sr->headers._extra_rows->total_len;

        mk_list_add_after(&sr->in_headers_extra._head,
                          &sr->in_headers._head,
                          &sr->stream.inputs);
    }

    sh->sent = MK_TRUE;

    return 0;
}